

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O1

set<int,_std::less<int>,_std::allocator<int>_> *
wallet::InterpretSubtractFeeFromOutputInstructions
          (set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,
          UniValue *sffo_instructions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *destinations)

{
  _Rb_tree_header *p_Var1;
  pointer pUVar2;
  pointer pbVar3;
  size_t __n;
  _Base_ptr p_Var4;
  bool bVar5;
  int iVar6;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar7;
  string *psVar8;
  UniValue *pUVar9;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  long lVar12;
  ulong uVar13;
  pointer this;
  long in_FS_OFFSET;
  int pos;
  int local_5c;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (sffo_instructions->typ != VNULL) {
    if (sffo_instructions->typ == VBOOL) {
      bVar5 = ::UniValue::get_bool(sffo_instructions);
      if (bVar5) {
        local_58._M_dataplus._M_p._0_4_ = 0;
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>(&__return_storage_ptr__->_M_t,(int *)&local_58);
      }
    }
    else {
      pvVar7 = ::UniValue::getValues(sffo_instructions);
      pUVar2 = (pvVar7->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (this = (pvVar7->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                  super__Vector_impl_data._M_start; this != pUVar2; this = this + 1) {
        if ((this->typ == VSTR) &&
           ((destinations->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish !=
            (destinations->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start)) {
          lVar12 = 8;
          uVar13 = 0;
          do {
            psVar8 = ::UniValue::get_str_abi_cxx11_(this);
            pbVar3 = (destinations->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(destinations->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <=
                uVar13) {
              if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_005dcf5c;
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar13);
              goto LAB_005dcd8d;
            }
            __n = psVar8->_M_string_length;
            if ((__n == *(size_t *)((long)&(pbVar3->_M_dataplus)._M_p + lVar12)) &&
               ((__n == 0 ||
                (iVar6 = bcmp((psVar8->_M_dataplus)._M_p,*(void **)((long)pbVar3 + lVar12 + -8),__n)
                , iVar6 == 0)))) {
              local_58._M_dataplus._M_p._0_4_ = (undefined4)uVar13;
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              _M_insert_unique<int>(&__return_storage_ptr__->_M_t,(int *)&local_58);
              break;
            }
            uVar13 = uVar13 + 1;
            lVar12 = lVar12 + 0x20;
          } while (uVar13 < (ulong)((long)(destinations->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(destinations->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        if (this->typ == VNUM) {
          local_5c = ::UniValue::getInt<int>(this);
          p_Var4 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var10 = &p_Var1->_M_header;
          for (; (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
              p_Var4 = (&p_Var4->_M_left)[(int)*(size_t *)(p_Var4 + 1) < local_5c]) {
            if (local_5c <= (int)*(size_t *)(p_Var4 + 1)) {
              p_Var10 = p_Var4;
            }
          }
          p_Var11 = p_Var1;
          if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
             (p_Var11 = (_Rb_tree_header *)p_Var10,
             local_5c < (int)((_Rb_tree_header *)p_Var10)->_M_node_count)) {
            p_Var11 = p_Var1;
          }
          if (p_Var11 != p_Var1) {
LAB_005dcd8d:
            pUVar9 = (UniValue *)__cxa_allocate_exception(0x58);
            tinyformat::format<int>
                      (&local_58,"Invalid parameter, duplicated position: %d",&local_5c);
            JSONRPCError(pUVar9,-8,&local_58);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar9,&::UniValue::typeinfo,::UniValue::~UniValue);
            }
            goto LAB_005dcf5c;
          }
          if (local_5c < 0) {
            pUVar9 = (UniValue *)__cxa_allocate_exception(0x58);
            tinyformat::format<int>(&local_58,"Invalid parameter, negative position: %d",&local_5c);
            JSONRPCError(pUVar9,-8,&local_58);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar9,&::UniValue::typeinfo,::UniValue::~UniValue);
            }
            goto LAB_005dcf5c;
          }
          if ((int)((ulong)((long)(destinations->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(destinations->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 5) <= local_5c) {
            pUVar9 = (UniValue *)__cxa_allocate_exception(0x58);
            tinyformat::format<int>(&local_58,"Invalid parameter, position too large: %d",&local_5c)
            ;
            JSONRPCError(pUVar9,-8,&local_58);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar9,&::UniValue::typeinfo,::UniValue::~UniValue);
            }
            goto LAB_005dcf5c;
          }
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     __return_storage_ptr__,&local_5c);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_005dcf5c:
  __stack_chk_fail();
}

Assistant:

std::set<int> InterpretSubtractFeeFromOutputInstructions(const UniValue& sffo_instructions, const std::vector<std::string>& destinations)
{
    std::set<int> sffo_set;
    if (sffo_instructions.isNull()) return sffo_set;
    if (sffo_instructions.isBool()) {
        if (sffo_instructions.get_bool()) sffo_set.insert(0);
        return sffo_set;
    }
    for (const auto& sffo : sffo_instructions.getValues()) {
        if (sffo.isStr()) {
            for (size_t i = 0; i < destinations.size(); ++i) {
                if (sffo.get_str() == destinations.at(i)) {
                    sffo_set.insert(i);
                    break;
                }
            }
        }
        if (sffo.isNum()) {
            int pos = sffo.getInt<int>();
            if (sffo_set.contains(pos))
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid parameter, duplicated position: %d", pos));
            if (pos < 0)
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid parameter, negative position: %d", pos));
            if (pos >= int(destinations.size()))
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid parameter, position too large: %d", pos));
            sffo_set.insert(pos);
        }
    }
    return sffo_set;
}